

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTendonAnchor,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcTendonAnchor *in;
  
  in = (IfcTendonAnchor *)operator_new(0x1b8);
  *(undefined ***)&(in->super_IfcReinforcingElement).field_0x1a0 = &PTR__Object_00806a70;
  *(undefined8 *)&in->field_0x1a8 = 0;
  *(char **)&in->field_0x1b0 = "IfcTendonAnchor";
  Assimp::IFC::Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
            ((IfcReinforcingElement *)in,&PTR_construction_vtable_24__00886da0);
  *(undefined ***)
   &(in->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = &PTR__IfcTendonAnchor_00886c20;
  *(undefined ***)&(in->super_IfcReinforcingElement).field_0x1a0 = &PTR__IfcTendonAnchor_00886d88;
  *(undefined ***)
   &(in->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = &PTR__IfcTendonAnchor_00886c48;
  (in->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcTendonAnchor_00886c70;
  *(undefined ***)
   &(in->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = &PTR__IfcTendonAnchor_00886c98;
  *(undefined ***)
   &(in->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = &PTR__IfcTendonAnchor_00886cc0;
  *(undefined ***)
   &(in->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = &PTR__IfcTendonAnchor_00886ce8;
  *(undefined ***)
   &(in->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = &PTR__IfcTendonAnchor_00886d10;
  *(undefined ***)
   &(in->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    field_0x158 = &PTR__IfcTendonAnchor_00886d38;
  *(undefined ***)&(in->super_IfcReinforcingElement).field_0x190 = &PTR__IfcTendonAnchor_00886d60;
  GenericFill<Assimp::IFC::Schema_2x3::IfcTendonAnchor>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                 super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                 field_0x0 +
         *(long *)(*(long *)&(in->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.
                             super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }